

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_CoverCountCubePairDiffs(Mvc_Cover_t *pCover,uchar *pDiffs)

{
  int iVar1;
  uint uVar2;
  Mvc_Cube_t *pCube;
  uchar *puVar3;
  uint local_58;
  int local_54;
  int _i_;
  int nCubePairs;
  int nOnes;
  int nBytes;
  uchar *pByteStop;
  uchar *pByteStart;
  uchar *pByte;
  Mvc_Cube_t *pMask;
  Mvc_Cube_t *pCube2;
  Mvc_Cube_t *pCube1;
  uchar *pDiffs_local;
  Mvc_Cover_t *pCover_local;
  
  pCube = Mvc_CubeAlloc(pCover);
  iVar1 = pCover->nBits;
  uVar2 = pCover->nBits;
  local_54 = 0;
  for (pCube2 = (pCover->lCubes).pHead; pCube2 != (Mvc_Cube_t *)0x0; pCube2 = pCube2->pNext) {
    for (pMask = pCube2->pNext; pMask != (Mvc_Cube_t *)0x0; pMask = pMask->pNext) {
      if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 0) {
        pCube->pData[0] = pCube2->pData[0] ^ pMask->pData[0];
      }
      else if ((*(uint *)&pCube2->field_0x8 & 0xffffff) == 1) {
        pCube->pData[0] = pCube2->pData[0] ^ pMask->pData[0];
        *(uint *)&pCube->field_0x14 = *(uint *)&pCube2->field_0x14 ^ *(uint *)&pMask->field_0x14;
      }
      else {
        for (local_58 = *(uint *)&pCube2->field_0x8 & 0xffffff; -1 < (int)local_58;
            local_58 = local_58 - 1) {
          pCube->pData[(int)local_58] = pCube2->pData[(int)local_58] ^ pMask->pData[(int)local_58];
        }
      }
      pByteStart = (uchar *)pCube->pData;
      puVar3 = (uchar *)((long)pByteStart +
                        (long)(int)((int)((ulong)(long)iVar1 >> 3) + (uint)((uVar2 & 7) != 0)));
      _i_ = 0;
      for (; pByteStart < puVar3; pByteStart = pByteStart + 1) {
        _i_ = bit_count[*pByteStart] + _i_;
      }
      pDiffs[local_54] = (uchar)_i_;
      local_54 = local_54 + 1;
    }
  }
  Mvc_CubeFree(pCover,pCube);
  return 1;
}

Assistant:

int Mvc_CoverCountCubePairDiffs( Mvc_Cover_t * pCover, unsigned char pDiffs[] )
{
    Mvc_Cube_t * pCube1;
    Mvc_Cube_t * pCube2;
    Mvc_Cube_t * pMask;
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nBytes, nOnes;
    int nCubePairs;

    // allocate a temporary mask
    pMask = Mvc_CubeAlloc( pCover );
    // get the number of unsigned chars in the cube's bit strings
    nBytes = pCover->nBits / (8 * sizeof(unsigned char)) + (int)(pCover->nBits % (8 * sizeof(unsigned char)) > 0);
    // iterate through the cubes
    nCubePairs = 0;
    Mvc_CoverForEachCube( pCover, pCube1 )
    {
        Mvc_CoverForEachCubeStart( Mvc_CubeReadNext(pCube1), pCube2 )
        {
            // find the bit-wise exor of cubes
            Mvc_CubeBitExor( pMask, pCube1, pCube2 );
            // set the starting and stopping positions
            pByteStart = (unsigned char *)pMask->pData;
            pByteStop  = pByteStart + nBytes;
            // clean the counter of ones
            nOnes = 0;
            // iterate through the positions
            for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
                nOnes += bit_count[*pByte];
            // set the nOnes
            pDiffs[nCubePairs++] = nOnes;
        }
    }
    // deallocate the mask
    Mvc_CubeFree( pCover, pMask );
    return 1;
}